

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O3

void __thiscall cmFindCommon::cmFindCommon(cmFindCommon *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Enabled = true;
  (this->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmFindCommon_005c6948;
  (this->UserHintsArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UserHintsArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UserHintsArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UserGuessArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UserGuessArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UserGuessArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CMakePathName)._M_dataplus._M_p = (pointer)&(this->CMakePathName).field_2;
  (this->CMakePathName)._M_string_length = 0;
  (this->CMakePathName).field_2._M_local_buf[0] = '\0';
  (this->SearchPathSuffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SearchPathSuffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SearchPathSuffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->PathGroupOrder).
  super__Vector_base<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PathGroupOrder).
  super__Vector_base<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PathGroupLabelMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PathGroupOrder).
  super__Vector_base<cmFindCommon::PathGroup,_std::allocator<cmFindCommon::PathGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PathLabelStringMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->LabeledPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SearchPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SearchPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->FindRootPathMode = RootPathModeBoth;
  this->NoDefaultPath = false;
  this->NoCMakePath = false;
  this->NoCMakeEnvironmentPath = false;
  this->NoSystemEnvironmentPath = false;
  this->NoCMakeSystemPath = false;
  this->SearchFrameworkFirst = false;
  this->SearchFrameworkOnly = false;
  this->SearchFrameworkLast = false;
  this->SearchAppBundleFirst = false;
  this->SearchAppBundleOnly = false;
  this->SearchAppBundleLast = false;
  InitializeSearchPathGroups(this);
  return;
}

Assistant:

cmFindCommon::cmFindCommon()
{
  this->FindRootPathMode = RootPathModeBoth;
  this->NoDefaultPath = false;
  this->NoCMakePath = false;
  this->NoCMakeEnvironmentPath = false;
  this->NoSystemEnvironmentPath = false;
  this->NoCMakeSystemPath = false;

  // OS X Bundle and Framework search policy.  The default is to
  // search frameworks first on apple.
#if defined(__APPLE__)
  this->SearchFrameworkFirst = true;
  this->SearchAppBundleFirst = true;
#else
  this->SearchFrameworkFirst = false;
  this->SearchAppBundleFirst = false;
#endif
  this->SearchFrameworkOnly = false;
  this->SearchFrameworkLast = false;
  this->SearchAppBundleOnly = false;
  this->SearchAppBundleLast = false;

  this->InitializeSearchPathGroups();
}